

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * tinyusdz::print_typed_attr<tinyusdz::Token>
                   (string *__return_storage_ptr__,TypedAttribute<tinyusdz::Token> *attr,
                   string *name,uint32_t indent)

{
  bool bVar1;
  AttrMeta *pAVar2;
  ostream *poVar3;
  value_type *tok;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *this;
  size_type sVar4;
  const_reference v;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  uint32_t n;
  uint32_t n_00;
  uint32_t n_01;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *paths;
  string local_278;
  string local_258;
  string local_238;
  undefined1 local_218 [8];
  optional<tinyusdz::Token> pv;
  string local_1d0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream aoStack_1a0 [380];
  uint32_t local_24;
  string *psStack_20;
  uint32_t indent_local;
  string *name_local;
  TypedAttribute<tinyusdz::Token> *attr_local;
  
  local_24 = indent;
  psStack_20 = name;
  name_local = (string *)attr;
  attr_local = (TypedAttribute<tinyusdz::Token> *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b0);
  bVar1 = TypedAttribute<tinyusdz::Token>::authored((TypedAttribute<tinyusdz::Token> *)name_local);
  if (bVar1) {
    pAVar2 = TypedAttribute<tinyusdz::Token>::metas((TypedAttribute<tinyusdz::Token> *)name_local);
    bVar1 = AttrMetas::authored(pAVar2);
    n = extraout_EDX;
    if ((((bVar1) ||
         (bVar1 = TypedAttribute<tinyusdz::Token>::is_blocked
                            ((TypedAttribute<tinyusdz::Token> *)name_local), n = extraout_EDX_00,
         bVar1)) ||
        (bVar1 = TypedAttribute<tinyusdz::Token>::has_value
                           ((TypedAttribute<tinyusdz::Token> *)name_local), n = extraout_EDX_01,
        bVar1)) ||
       ((bVar1 = TypedAttribute<tinyusdz::Token>::is_value_empty
                           ((TypedAttribute<tinyusdz::Token> *)name_local), n = extraout_EDX_02,
        bVar1 || (bVar1 = TypedAttribute<tinyusdz::Token>::is_connection
                                    ((TypedAttribute<tinyusdz::Token> *)name_local),
                 n = extraout_EDX_03, !bVar1)))) {
      pprint::Indent_abi_cxx11_(&local_1d0,(pprint *)(ulong)local_24,n);
      std::operator<<(aoStack_1a0,(string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::operator<<(aoStack_1a0,"uniform ");
      value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
      poVar3 = std::operator<<(aoStack_1a0,(string *)((long)&pv.contained + 0x18));
      poVar3 = std::operator<<(poVar3," ");
      std::operator<<(poVar3,(string *)psStack_20);
      std::__cxx11::string::~string((string *)((long)&pv.contained + 0x18));
      bVar1 = TypedAttribute<tinyusdz::Token>::is_blocked
                        ((TypedAttribute<tinyusdz::Token> *)name_local);
      if (bVar1) {
        std::operator<<(aoStack_1a0," = None");
      }
      else {
        bVar1 = TypedAttribute<tinyusdz::Token>::is_value_empty
                          ((TypedAttribute<tinyusdz::Token> *)name_local);
        if (!bVar1) {
          TypedAttribute<tinyusdz::Token>::get_value
                    ((optional<tinyusdz::Token> *)local_218,
                     (TypedAttribute<tinyusdz::Token> *)name_local);
          bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_218);
          if (bVar1) {
            poVar3 = std::operator<<(aoStack_1a0," = ");
            tok = nonstd::optional_lite::optional<tinyusdz::Token>::value
                            ((optional<tinyusdz::Token> *)local_218);
            std::operator<<(poVar3,tok);
          }
          nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                    ((optional<tinyusdz::Token> *)local_218);
        }
      }
      pAVar2 = TypedAttribute<tinyusdz::Token>::metas((TypedAttribute<tinyusdz::Token> *)name_local)
      ;
      bVar1 = AttrMetas::authored(pAVar2);
      if (bVar1) {
        poVar3 = std::operator<<(aoStack_1a0," (\n");
        pAVar2 = TypedAttribute<tinyusdz::Token>::metas
                           ((TypedAttribute<tinyusdz::Token> *)name_local);
        print_attr_metas_abi_cxx11_
                  (&local_238,(tinyusdz *)pAVar2,(AttrMeta *)(ulong)(local_24 + 1),indent);
        poVar3 = std::operator<<(poVar3,(string *)&local_238);
        pprint::Indent_abi_cxx11_(&local_258,(pprint *)(ulong)local_24,n_00);
        poVar3 = std::operator<<(poVar3,(string *)&local_258);
        std::operator<<(poVar3,")");
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::~string((string *)&local_238);
      }
      std::operator<<(aoStack_1a0,"\n");
    }
    bVar1 = TypedAttribute<tinyusdz::Token>::has_connections
                      ((TypedAttribute<tinyusdz::Token> *)name_local);
    if (bVar1) {
      pprint::Indent_abi_cxx11_(&local_278,(pprint *)(ulong)local_24,n_01);
      std::operator<<(aoStack_1a0,(string *)&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      std::operator<<(aoStack_1a0,"uniform ");
      value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
      poVar3 = std::operator<<(aoStack_1a0,(string *)&paths);
      poVar3 = std::operator<<(poVar3," ");
      std::operator<<(poVar3,(string *)psStack_20);
      std::__cxx11::string::~string((string *)&paths);
      std::operator<<(aoStack_1a0,".connect = ");
      this = TypedAttribute<tinyusdz::Token>::get_connections
                       ((TypedAttribute<tinyusdz::Token> *)name_local);
      sVar4 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(this);
      if (sVar4 == 1) {
        v = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[](this,0);
        std::operator<<(aoStack_1a0,v);
      }
      else {
        sVar4 = std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size(this);
        if (sVar4 == 0) {
          std::operator<<(aoStack_1a0,"[InternalError]");
        }
        else {
          std::operator<<(aoStack_1a0,this);
        }
      }
      std::operator<<(aoStack_1a0,"\n");
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<T> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    if (attr.metas().authored() || attr.is_blocked() || attr.has_value() || attr.is_value_empty() || (!attr.is_connection())) {
      ss << pprint::Indent(indent);
      ss << "uniform ";
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (attr.is_value_empty()) {
        // nothing to do
      } else {
        auto pv = attr.get_value();
        if (pv) {
          ss << " = " << pv.value();
        }
      }

      if (attr.metas().authored()) {
        ss << " (\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    if (attr.has_connections()) {
      ss << pprint::Indent(indent);
      ss << "uniform ";
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".connect = ";

      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }

      ss << "\n";
    }
  }

  return ss.str();
}